

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::ProcessHorizontals(Clipper *this)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge **ppTVar3;
  TEdge *horzEdge;
  
  horzEdge = this->m_SortedEdges;
  if (horzEdge != (TEdge *)0x0) {
    do {
      pTVar1 = horzEdge->nextInSEL;
      pTVar2 = horzEdge->prevInSEL;
      ppTVar3 = &pTVar2->nextInSEL;
      if (pTVar2 == (TEdge *)0x0) {
        ppTVar3 = &this->m_SortedEdges;
      }
      *ppTVar3 = pTVar1;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->prevInSEL = pTVar2;
      }
      horzEdge->nextInSEL = (TEdge *)0x0;
      horzEdge->prevInSEL = (TEdge *)0x0;
      ProcessHorizontal(this,horzEdge);
      horzEdge = this->m_SortedEdges;
    } while (horzEdge != (TEdge *)0x0);
  }
  return;
}

Assistant:

void Clipper::ProcessHorizontals()
{
  TEdge* horzEdge = m_SortedEdges;
  while( horzEdge )
  {
    DeleteFromSEL( horzEdge );
    ProcessHorizontal( horzEdge );
    horzEdge = m_SortedEdges;
  }
}